

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderMultisampleInterpolationStateQueryTests::init
          (ShaderMultisampleInterpolationStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  TestNode *pTVar1;
  InterpolationOffsetCase *pIVar2;
  long lVar3;
  ulong extraout_RAX;
  FragmentInterpolationOffsetBitsCase *this_00;
  ulong uVar4;
  uint local_44;
  int verifierNdx_2;
  TestCaseGroup *group_2;
  int verifierNdx_1;
  TestCaseGroup *group_1;
  int verifierNdx;
  TestCaseGroup *group;
  ShaderMultisampleInterpolationStateQueryTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "min_fragment_interpolation_offset","Test MIN_FRAGMENT_INTERPOLATION_OFFSET");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  for (group_1._0_4_ = 0; (int)group_1 < 4; group_1._0_4_ = (int)group_1 + 1) {
    pIVar2 = (InterpolationOffsetCase *)operator_new(0x80);
    lVar3 = (long)(int)group_1;
    anon_unknown_1::InterpolationOffsetCase::InterpolationOffsetCase
              (pIVar2,(this->super_TestCaseGroup).m_context,init::verifiers[lVar3].name,
               init::verifiers[lVar3].desc,init::verifiers[lVar3].verifier,TEST_MIN_OFFSET);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pIVar2);
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "max_fragment_interpolation_offset","Test MAX_FRAGMENT_INTERPOLATION_OFFSET");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  for (group_2._4_4_ = 0; group_2._4_4_ < 4; group_2._4_4_ = group_2._4_4_ + 1) {
    pIVar2 = (InterpolationOffsetCase *)operator_new(0x80);
    lVar3 = (long)group_2._4_4_;
    anon_unknown_1::InterpolationOffsetCase::InterpolationOffsetCase
              (pIVar2,(this->super_TestCaseGroup).m_context,init::verifiers[lVar3].name,
               init::verifiers[lVar3].desc,init::verifiers[lVar3].verifier,TEST_MAX_OFFSET);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pIVar2);
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "fragment_interpolation_offset_bits","Test FRAGMENT_INTERPOLATION_OFFSET_BITS");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_44 = 0;
  uVar4 = extraout_RAX;
  while ((int)local_44 < 4) {
    this_00 = (FragmentInterpolationOffsetBitsCase *)operator_new(0x80);
    lVar3 = (long)(int)local_44;
    anon_unknown_1::FragmentInterpolationOffsetBitsCase::FragmentInterpolationOffsetBitsCase
              (this_00,(this->super_TestCaseGroup).m_context,init::verifiers[lVar3].name,
               init::verifiers[lVar3].desc,init::verifiers[lVar3].verifier);
    tcu::TestNode::addChild(pTVar1,(TestNode *)this_00);
    local_44 = local_44 + 1;
    uVar4 = (ulong)local_44;
  }
  return (int)uVar4;
}

Assistant:

void ShaderMultisampleInterpolationStateQueryTests::init (void)
{
	static const struct Verifier
	{
		QueryType		verifier;
		const char*		name;
		const char*		desc;
	} verifiers[] =
	{
		{ QUERY_BOOLEAN,	"get_boolean",		"Test using getBoolean"		},
		{ QUERY_INTEGER,	"get_integer",		"Test using getInteger"		},
		{ QUERY_FLOAT,		"get_float",		"Test using getFloat"		},
		{ QUERY_INTEGER64,	"get_integer64",	"Test using getInteger64"	},
	};

	// .min_fragment_interpolation_offset
	{
		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "min_fragment_interpolation_offset", "Test MIN_FRAGMENT_INTERPOLATION_OFFSET");
		addChild(group);

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
			group->addChild(new InterpolationOffsetCase(m_context, verifiers[verifierNdx].name, verifiers[verifierNdx].desc, verifiers[verifierNdx].verifier, InterpolationOffsetCase::TEST_MIN_OFFSET));
	}

	// .max_fragment_interpolation_offset
	{
		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "max_fragment_interpolation_offset", "Test MAX_FRAGMENT_INTERPOLATION_OFFSET");
		addChild(group);

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
			group->addChild(new InterpolationOffsetCase(m_context, verifiers[verifierNdx].name, verifiers[verifierNdx].desc, verifiers[verifierNdx].verifier, InterpolationOffsetCase::TEST_MAX_OFFSET));
	}

	// .fragment_interpolation_offset_bits
	{
		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "fragment_interpolation_offset_bits", "Test FRAGMENT_INTERPOLATION_OFFSET_BITS");
		addChild(group);

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
			group->addChild(new FragmentInterpolationOffsetBitsCase(m_context, verifiers[verifierNdx].name, verifiers[verifierNdx].desc, verifiers[verifierNdx].verifier));
	}
}